

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O2

void __thiscall HEkkDual::initSlice(HEkkDual *this,HighsInt initial_num_slice)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int size_;
  long lVar9;
  vector<int,_std::allocator<int>_> sliced_Astart;
  
  uVar4 = 1;
  if (1 < initial_num_slice) {
    uVar4 = (ulong)(uint)initial_num_slice;
  }
  this->slice_num = (HighsInt)uVar4;
  if (8 < initial_num_slice) {
    highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kWarning,
                "WARNING: %d = slice_num > kHighsSlicedLimit = %d so truncating slice_num\n",uVar4,8
               );
    this->slice_num = 8;
    uVar4 = 8;
  }
  piVar3 = (this->a_matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = this->solver_num_col;
  iVar2 = piVar3[iVar1];
  this->slice_start[0] = 0;
  lVar6 = 0;
  uVar7 = 0;
  do {
    if (uVar7 == (int)uVar4 - 1) {
      iVar5 = this->slice_num;
      goto LAB_00337fcb;
    }
    iVar5 = (int)uVar7;
    lVar9 = (long)(int)lVar6;
    do {
      lVar6 = lVar9 + 1;
      lVar8 = lVar9 + 1;
      lVar9 = lVar6;
    } while (piVar3[lVar8] < (int)((double)(int)(uVar7 + 1) * ((double)iVar2 / (double)(int)uVar4)))
    ;
    this->slice_start[uVar7 + 1] = (int)lVar6;
    uVar7 = uVar7 + 1;
  } while ((int)lVar6 < iVar1);
  this->slice_num = iVar5;
LAB_00337fcb:
  this->slice_start[iVar5] = iVar1;
  sliced_Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  sliced_Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  sliced_Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lVar6 = 0;
  while (lVar6 < this->slice_num) {
    iVar1 = this->slice_start[lVar6];
    lVar8 = (long)iVar1;
    iVar2 = this->slice_start[lVar6 + 1];
    lVar9 = iVar2 - lVar8;
    iVar5 = piVar3[lVar8];
    std::vector<int,_std::allocator<int>_>::resize(&sliced_Astart,lVar9 + 1);
    size_ = (int)lVar9;
    for (lVar9 = 0; lVar9 <= size_; lVar9 = lVar9 + 1) {
      sliced_Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar9] = piVar3[lVar8 + lVar9] - iVar5;
    }
    HighsSparseMatrix::createSlice
              (this->slice_a_matrix + lVar6,&(this->ekk_instance_->lp_).a_matrix_,iVar1,iVar2 + -1);
    HighsSparseMatrix::createRowwise(this->slice_ar_matrix + lVar6,this->slice_a_matrix + lVar6);
    HVectorBase<double>::setup(this->slice_row_ap + lVar6,size_);
    HEkkDualRow::setupSlice
              ((this->slice_dualRow).super__Vector_base<HEkkDualRow,_std::allocator<HEkkDualRow>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar6,size_);
    lVar6 = lVar6 + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sliced_Astart.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void HEkkDual::initSlice(const HighsInt initial_num_slice) {
  // Number of slices
  slice_num = initial_num_slice;
  if (slice_num < 1) slice_num = 1;
  assert(slice_num <= kHighsSlicedLimit);
  if (slice_num > kHighsSlicedLimit) {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kWarning,
                "WARNING: %" HIGHSINT_FORMAT
                " = slice_num > kHighsSlicedLimit = %" HIGHSINT_FORMAT
                " so truncating "
                "slice_num\n",
                slice_num, kHighsSlicedLimit);
    slice_num = kHighsSlicedLimit;
  }

  // Alias to the matrix
  const HighsInt* Astart = a_matrix->start_.data();
  const HighsInt AcountX = Astart[solver_num_col];

  // Figure out partition weight
  double sliced_countX = AcountX / (double)slice_num;
  slice_start[0] = 0;
  for (HighsInt i = 0; i < slice_num - 1; i++) {
    HighsInt endColumn = slice_start[i] + 1;  // At least one column
    HighsInt endX = Astart[endColumn];
    HighsInt stopX = (i + 1) * sliced_countX;
    while (endX < stopX) {
      endX = Astart[++endColumn];
    }
    slice_start[i + 1] = endColumn;
    if (endColumn >= solver_num_col) {
      slice_num = i;  // SHRINK
      break;
    }
  }
  slice_start[slice_num] = solver_num_col;

  // Partition the matrix, row_ap and related packet
  vector<HighsInt> sliced_Astart;
  for (HighsInt i = 0; i < slice_num; i++) {
    // The matrix
    HighsInt from_col = slice_start[i];
    HighsInt to_col = slice_start[i + 1] - 1;
    HighsInt slice_num_col = slice_start[i + 1] - from_col;
    HighsInt from_el = Astart[from_col];
    sliced_Astart.resize(slice_num_col + 1);
    for (HighsInt k = 0; k <= slice_num_col; k++)
      sliced_Astart[k] = Astart[k + from_col] - from_el;
    slice_a_matrix[i].createSlice(ekk_instance_.lp_.a_matrix_, from_col,
                                  to_col);
    slice_ar_matrix[i].createRowwise(slice_a_matrix[i]);

    // The row_ap and its packages
    slice_row_ap[i].setup(slice_num_col);
    slice_dualRow[i].setupSlice(slice_num_col);
  }
}